

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandExact(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  Gia_Man_t *pNew;
  Abc_Ntk_t *pNtk;
  long lVar6;
  char *pcVar7;
  int *local_2e8;
  int *local_2c8;
  Gia_Man_t *pGiaRes;
  Abc_Ntk_t *pNtkRes;
  int local_288;
  int fHasArrTimeProfile;
  int pArrTimeProfile [8];
  word pTruth [64];
  char *local_60;
  char *p2;
  char *p1;
  int nBTLimit;
  int nStartGates;
  int nFunc;
  int nVarsTmp;
  int nVars;
  int fVerbose;
  int fTest;
  int fMakeAIG;
  int nMaxDepth;
  int c;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  fTest = -1;
  bVar2 = false;
  bVar1 = false;
  nVarsTmp = 0;
  nFunc = 0;
  nBTLimit = 0;
  p1._4_4_ = 1;
  p1._0_4_ = 400000;
  bVar3 = false;
  Extra_UtilGetoptReset();
LAB_002670cf:
  iVar4 = Extra_UtilGetopt(argc,argv,"DASCatvh");
  if (iVar4 == -1) {
    if (bVar1) {
      printf("run test suite, ignore all other settings\n");
      Abc_ExactTest(nVarsTmp);
      Abc_ExactStoreTest(nVarsTmp);
      return 0;
    }
    if (argc != globalUtilOptind) {
      memset(pArrTimeProfile + 6,0,0x200);
      iVar4 = nFunc;
      goto LAB_002673b1;
    }
    goto LAB_0026761d;
  }
  switch(iVar4) {
  case 0x41:
    if (globalUtilOptind < argc) {
      bVar3 = true;
      local_60 = argv[globalUtilOptind];
      globalUtilOptind = globalUtilOptind + 1;
      p2 = local_60;
      do {
        if (*local_60 == ',') {
          *local_60 = '\0';
          iVar4 = atoi(p2);
          (&local_288)[nFunc] = iVar4;
          p2 = local_60 + 1;
          *local_60 = ',';
          nFunc = nFunc + 1;
        }
        else if (*local_60 == '\0') goto code_r0x00267236;
        local_60 = local_60 + 1;
      } while( true );
    }
    Abc_Print(-1,"Command line switch \"-A\" should be followed by an integer.\n");
    goto LAB_0026761d;
  default:
    goto LAB_0026761d;
  case 0x43:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-C\" should be followed by an integer.\n");
      goto LAB_0026761d;
    }
    p1._0_4_ = atoi(argv[globalUtilOptind]);
    globalUtilOptind = globalUtilOptind + 1;
    goto LAB_002670cf;
  case 0x44:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-D\" should be followed by an integer.\n");
      goto LAB_0026761d;
    }
    fTest = atoi(argv[globalUtilOptind]);
    globalUtilOptind = globalUtilOptind + 1;
    if (fTest < 0) goto LAB_0026761d;
    goto LAB_002670cf;
  case 0x53:
    goto switchD_0026711b_caseD_53;
  case 0x61:
    bVar2 = (bool)(bVar2 ^ 1);
    goto LAB_002670cf;
  case 0x68:
    goto LAB_0026761d;
  case 0x74:
    bVar1 = (bool)(bVar1 ^ 1);
    goto LAB_002670cf;
  case 0x76:
    nVarsTmp = nVarsTmp ^ 1;
    goto LAB_002670cf;
  }
LAB_002673b1:
  do {
    nFunc = iVar4;
    if (argc <= globalUtilOptind) {
      if (bVar2) {
        if (bVar3) {
          local_2c8 = &local_288;
        }
        else {
          local_2c8 = (int *)0x0;
        }
        pNew = Gia_ManFindExact((word *)(pArrTimeProfile + 6),nFunc,nBTLimit,fTest,local_2c8,
                                (uint)p1,p1._4_4_ - 1,nVarsTmp);
        if (pNew == (Gia_Man_t *)0x0) {
          Abc_Print(0,
                    "Could not find AIG within given resource constraints, retry with different value for -C.\n"
                   );
        }
        else {
          Abc_FrameUpdateGia(pAbc,pNew);
        }
      }
      else {
        if (bVar3) {
          local_2e8 = &local_288;
        }
        else {
          local_2e8 = (int *)0x0;
        }
        pNtk = Abc_NtkFindExact((word *)(pArrTimeProfile + 6),nFunc,nBTLimit,fTest,local_2e8,
                                (uint)p1,p1._4_4_ - 1,nVarsTmp);
        if (pNtk == (Abc_Ntk_t *)0x0) {
          Abc_Print(0,
                    "Could not find network within given resource constraints, retry with different value for -C.\n"
                   );
        }
        else {
          Abc_FrameReplaceCurrentNetwork(pAbc,pNtk);
          Abc_FrameClearVerifStatus(pAbc);
        }
      }
      return 0;
    }
    if (nBTLimit == 0x10) {
      Abc_Print(-1,"Too many functions (at most 16 supported).\n");
      goto LAB_0026761d;
    }
    lVar6 = (long)globalUtilOptind;
    globalUtilOptind = globalUtilOptind + 1;
    iVar5 = Abc_TtReadHex(pTruth + (long)(nBTLimit << 2) + -1,argv[lVar6]);
    nBTLimit = nBTLimit + 1;
    iVar4 = iVar5;
  } while (nFunc == 0);
  if (8 < nFunc) {
    Abc_Print(-1,"Only 8-variable functions are supported.\n");
    goto LAB_0026761d;
  }
  iVar4 = nFunc;
  if (nFunc != iVar5) {
    Abc_Print(-1,"All functions need to have the same size.\n");
LAB_0026761d:
    Abc_Print(-2,"usage: exact [-DSC <num>] [-A <list>] [-atvh] <truth1> <truth2> ...\n");
    Abc_Print(-2,
              "\t           finds optimum networks using SAT-based exact synthesis for hex truth tables <truth1> <truth2> ...\n"
             );
    Abc_Print(-2,"\t-D <num>  : constrain maximum depth (if too low, algorithm may not terminate)\n"
             );
    Abc_Print(-2,"\t-A <list> : input arrival times (comma separated list)\n");
    Abc_Print(-2,"\t-S <num>  : number of start gates in search [default = %d]\n",(ulong)p1._4_4_);
    Abc_Print(-2,
              "\t-C <num>  : the limit on the number of conflicts; turn off with 0 [default = %d]\n"
              ,(ulong)(uint)p1);
    pcVar7 = "no";
    if (bVar2) {
      pcVar7 = "yes";
    }
    Abc_Print(-2,"\t-a        : toggle create AIG [default = %s]\n",pcVar7);
    Abc_Print(-2,"\t-t        : run test suite\n");
    pcVar7 = "no";
    if (nVarsTmp != 0) {
      pcVar7 = "yes";
    }
    Abc_Print(-2,"\t-v        : toggle verbose printout [default = %s]\n",pcVar7);
    Abc_Print(-2,"\t-h        : print the command usage\n");
    Abc_Print(-2,"\t\n");
    Abc_Print(-2,
              "\t            This command was contributed by Mathias Soeken from EPFL in July 2016.\n"
             );
    Abc_Print(-2,"\t            The author can be contacted as mathias.soeken at epfl.ch\n");
    return 1;
  }
  goto LAB_002673b1;
switchD_0026711b_caseD_53:
  if (argc <= globalUtilOptind) {
    Abc_Print(-1,"Command line switch \"-S\" should be followed by an integer.\n");
    goto LAB_0026761d;
  }
  p1._4_4_ = atoi(argv[globalUtilOptind]);
  globalUtilOptind = globalUtilOptind + 1;
  if ((int)p1._4_4_ < 1) goto LAB_0026761d;
  goto LAB_002670cf;
code_r0x00267236:
  iVar4 = atoi(p2);
  (&local_288)[nFunc] = iVar4;
  nFunc = nFunc + 1;
  goto LAB_002670cf;
}

Assistant:

int Abc_CommandExact( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Gia_Man_t * Gia_ManFindExact( word * pTruth, int nVars, int nFunc, int nMaxDepth, int * pArrivalTimes, int nBTLimit, int nStartGates, int fVerbose );

    int c, nMaxDepth = -1, fMakeAIG = 0, fTest = 0, fVerbose = 0, nVars = 0, nVarsTmp, nFunc = 0, nStartGates = 1, nBTLimit = 400000;
    char * p1, * p2;
    word pTruth[64];
    int pArrTimeProfile[8], fHasArrTimeProfile = 0;
    Abc_Ntk_t * pNtkRes;
    Gia_Man_t * pGiaRes;

    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "DASCatvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'D':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-D\" should be followed by an integer.\n" );
                goto usage;
            }
            nMaxDepth = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nMaxDepth < 0 )
                goto usage;
            break;
        case 'A':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-A\" should be followed by an integer.\n" );
                goto usage;
            }
            fHasArrTimeProfile = 1;
            p1 = p2 = argv[globalUtilOptind++];
            while ( true ) {
                if ( *p2 == ',' )
                {
                    *p2 = '\0';
                    pArrTimeProfile[nVars++] = atoi( p1 );
                    *p2++ = ',';
                    p1 = p2;
                }
                else if ( *p2 == '\0' )
                {
                    pArrTimeProfile[nVars++] = atoi( p1 );
                    break;
                }
                else
                    ++p2;
            }
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by an integer.\n" );
                goto usage;
            }
            nStartGates = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nStartGates < 1 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            nBTLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            break;
        case 'a':
            fMakeAIG ^= 1;
            break;
        case 't':
            fTest ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( fTest )
    {
        extern void Abc_ExactTest( int fVerbose );
        extern void Abc_ExactStoreTest( int fVerbose );

        printf( "run test suite, ignore all other settings\n" );
        Abc_ExactTest( fVerbose );
        Abc_ExactStoreTest( fVerbose );
        return 0;
    }

    if ( argc == globalUtilOptind )
        goto usage;

    memset( pTruth, 0, 64 * sizeof(word) );
    while ( globalUtilOptind < argc )
    {
        if ( nFunc == 16 )
        {
            Abc_Print( -1, "Too many functions (at most 16 supported).\n" );
            goto usage;
        }
        nVarsTmp = Abc_TtReadHex( &pTruth[nFunc << 2], argv[globalUtilOptind++] );
        nFunc++;
        if ( nVars == 0 )
            nVars = nVarsTmp;
        else if ( nVars > 8 )
        {
            Abc_Print( -1, "Only 8-variable functions are supported.\n" );
            goto usage;
        }
        else if ( nVars != nVarsTmp )
        {
            Abc_Print( -1, "All functions need to have the same size.\n" );
            goto usage;
        }
    }

    if ( fMakeAIG )
    {
        pGiaRes = Gia_ManFindExact( pTruth, nVars, nFunc, nMaxDepth, fHasArrTimeProfile ? pArrTimeProfile : NULL, nBTLimit, nStartGates - 1, fVerbose );
        if ( pGiaRes )
            Abc_FrameUpdateGia( pAbc, pGiaRes );
        else
            Abc_Print( 0, "Could not find AIG within given resource constraints, retry with different value for -C.\n" );
    }
    else
    {
        pNtkRes = Abc_NtkFindExact( pTruth, nVars, nFunc, nMaxDepth, fHasArrTimeProfile ? pArrTimeProfile : NULL, nBTLimit, nStartGates - 1, fVerbose );
        if ( pNtkRes )
        {
            Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
            Abc_FrameClearVerifStatus( pAbc );
        }
        else
            Abc_Print( 0, "Could not find network within given resource constraints, retry with different value for -C.\n" );
    }
    return 0;

usage:
    Abc_Print( -2, "usage: exact [-DSC <num>] [-A <list>] [-atvh] <truth1> <truth2> ...\n" );
    Abc_Print( -2, "\t           finds optimum networks using SAT-based exact synthesis for hex truth tables <truth1> <truth2> ...\n" );
    Abc_Print( -2, "\t-D <num>  : constrain maximum depth (if too low, algorithm may not terminate)\n" );
    Abc_Print( -2, "\t-A <list> : input arrival times (comma separated list)\n" );
    Abc_Print( -2, "\t-S <num>  : number of start gates in search [default = %d]\n", nStartGates );
    Abc_Print( -2, "\t-C <num>  : the limit on the number of conflicts; turn off with 0 [default = %d]\n", nBTLimit );
    Abc_Print( -2, "\t-a        : toggle create AIG [default = %s]\n", fMakeAIG ? "yes" : "no" );
    Abc_Print( -2, "\t-t        : run test suite\n" );
    Abc_Print( -2, "\t-v        : toggle verbose printout [default = %s]\n", fVerbose ? "yes" : "no" );
    Abc_Print( -2, "\t-h        : print the command usage\n" );
    Abc_Print( -2, "\t\n" );
    Abc_Print( -2, "\t            This command was contributed by Mathias Soeken from EPFL in July 2016.\n" );
    Abc_Print( -2, "\t            The author can be contacted as mathias.soeken at epfl.ch\n" );
    return 1;
}